

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayCopy
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayCopy *curr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t __new_size;
  Literal *pLVar3;
  uint64_t uVar4;
  long lVar5;
  shared_ptr<wasm::GCData> sVar6;
  undefined1 local_1e0 [8];
  Flow destRef;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> copied;
  Flow destIndex;
  Flow srcRef;
  Flow srcIndex;
  Flow length;
  shared_ptr<wasm::GCData> destData;
  shared_ptr<wasm::GCData> srcData;
  
  visit((Flow *)local_1e0,this,curr->destRef);
  if (destRef.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,this,curr->destIndex);
    if (destIndex.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&destIndex.breakTo.super_IString.str._M_str,this,curr->srcRef);
      if (srcRef.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&srcRef.breakTo.super_IString.str._M_str,this,curr->srcIndex);
        if (srcIndex.breakTo.super_IString.str._M_len == 0) {
          visit((Flow *)&srcIndex.breakTo.super_IString.str._M_str,this,curr->length);
          if (length.breakTo.super_IString.str._M_len == 0) {
            if (((long)((long)destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       destRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                       id) >> 3) * -0x5555555555555555 + (long)local_1e0 != 1) {
LAB_00d381df:
              __assert_fail("values.size() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                            ,0x52,"const Literal &wasm::Flow::getSingleValue()");
            }
            sVar6 = Literal::getGCData((Literal *)&length.breakTo.super_IString.str._M_str);
            if (length.breakTo.super_IString.str._M_str == (char *)0x0) {
              (*this->_vptr_ExpressionRunner[2])
                        (this,"null ref",
                         sVar6.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._M_pi);
            }
            if (destIndex.breakTo.super_IString.str._M_str +
                ((long)((long)srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       srcRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
                       ) >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00d381df;
            sVar6 = Literal::getGCData((Literal *)
                                       &destData.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
            if (destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*this->_vptr_ExpressionRunner[2])
                        (this,"null ref",
                         sVar6.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._M_pi);
            }
            if (((long)((long)destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       destIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type
                       .id) >> 3) * -0x5555555555555555 +
                (long)copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != 1) goto LAB_00d381df;
            uVar1 = Literal::getUnsigned((Literal *)&destIndex);
            if (srcRef.breakTo.super_IString.str._M_str +
                ((long)((long)srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                       id) >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00d381df;
            uVar2 = Literal::getUnsigned((Literal *)&srcIndex);
            if (srcIndex.breakTo.super_IString.str._M_str +
                ((long)((long)length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
                       ) >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00d381df;
            __new_size = Literal::getUnsigned((Literal *)&length);
            if ((ulong)((*(long *)(length.breakTo.super_IString.str._M_str + 0x30) -
                         *(long *)(length.breakTo.super_IString.str._M_str + 0x28) >> 3) *
                        -0x5555555555555555 + *(long *)(length.breakTo.super_IString.str._M_str + 8)
                       ) < uVar1 + __new_size) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob");
            }
            if ((ulong)(((long)destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[3]._vptr__Sp_counted_base -
                         *(long *)&destData.
                                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi[2]._M_use_count >> 3) * -0x5555555555555555 +
                       *(long *)&(destData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count) < uVar2 + __new_size) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob");
            }
            destRef.breakTo.super_IString.str._M_str = (char *)0x0;
            copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &destRef.breakTo.super_IString.str._M_str,__new_size);
            if (__new_size != 0) {
              lVar5 = 0;
              uVar4 = 0;
              do {
                pLVar3 = (Literal *)
                         (*(long *)&destData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi[2]._M_use_count + uVar2 * 0x18 + -0x18 + lVar5
                         );
                if (uVar2 == uVar4) {
                  pLVar3 = (Literal *)
                           (destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 1);
                }
                Literal::operator=((Literal *)(destRef.breakTo.super_IString.str._M_str + lVar5),
                                   pLVar3);
                uVar4 = uVar4 - 1;
                lVar5 = lVar5 + 0x18;
              } while (-uVar4 != __new_size);
              lVar5 = 0;
              uVar2 = 0;
              do {
                pLVar3 = (Literal *)
                         (*(long *)(length.breakTo.super_IString.str._M_str + 0x28) +
                          uVar1 * 0x18 + -0x18 + lVar5);
                if (uVar1 == uVar2) {
                  pLVar3 = (Literal *)(length.breakTo.super_IString.str._M_str + 0x10);
                }
                Literal::operator=(pLVar3,(Literal *)
                                          (destRef.breakTo.super_IString.str._M_str + lVar5));
                uVar2 = uVar2 - 1;
                lVar5 = lVar5 + 0x18;
              } while (-uVar2 != __new_size);
            }
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .field_0.func.super_IString.str._M_str = (char *)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .type.id = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .field_0.i64 = 0;
            (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &destRef.breakTo.super_IString.str._M_str);
            if (srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
            }
            if (destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
          }
          else {
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
                 (size_t)srcIndex.breakTo.super_IString.str._M_str;
            Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                             fixed._M_elems,(Literal *)&length);
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type
                          .id;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
            length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->breakTo).super_IString.str._M_len =
                 (size_t)length.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            (__return_storage_ptr__->breakTo).super_IString.str._M_str =
                 (char *)length.breakTo.super_IString.str._M_len;
          }
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
          Literal::~Literal((Literal *)&length);
        }
        else {
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
               (size_t)srcRef.breakTo.super_IString.str._M_str;
          Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                           fixed._M_elems,(Literal *)&srcIndex);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type
                        .id;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish =
               srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish;
          srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len =
               (size_t)srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str =
               (char *)srcIndex.breakTo.super_IString.str._M_len;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &srcIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        Literal::~Literal((Literal *)&srcIndex);
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)destIndex.breakTo.super_IString.str._M_str;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&srcRef);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)srcRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        srcRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)srcRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)srcRef.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &srcRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&srcRef);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&destIndex);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)destIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
      ;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      destIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)destIndex.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)destIndex.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &destIndex.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&destIndex);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_1e0;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&destRef);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)destRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    destRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)destRef.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)destRef.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &destRef.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&destRef);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayCopy(ArrayCopy* curr) {
    NOTE_ENTER("ArrayCopy");
    Flow destRef = self()->visit(curr->destRef);
    if (destRef.breaking()) {
      return destRef;
    }
    Flow destIndex = self()->visit(curr->destIndex);
    if (destIndex.breaking()) {
      return destIndex;
    }
    Flow srcRef = self()->visit(curr->srcRef);
    if (srcRef.breaking()) {
      return srcRef;
    }
    Flow srcIndex = self()->visit(curr->srcIndex);
    if (srcIndex.breaking()) {
      return srcIndex;
    }
    Flow length = self()->visit(curr->length);
    if (length.breaking()) {
      return length;
    }
    auto destData = destRef.getSingleValue().getGCData();
    if (!destData) {
      trap("null ref");
    }
    auto srcData = srcRef.getSingleValue().getGCData();
    if (!srcData) {
      trap("null ref");
    }
    size_t destVal = destIndex.getSingleValue().getUnsigned();
    size_t srcVal = srcIndex.getSingleValue().getUnsigned();
    size_t lengthVal = length.getSingleValue().getUnsigned();
    if (destVal + lengthVal > destData->values.size()) {
      trap("oob");
    }
    if (srcVal + lengthVal > srcData->values.size()) {
      trap("oob");
    }
    std::vector<Literal> copied;
    copied.resize(lengthVal);
    for (size_t i = 0; i < lengthVal; i++) {
      copied[i] = srcData->values[srcVal + i];
    }
    for (size_t i = 0; i < lengthVal; i++) {
      destData->values[destVal + i] = copied[i];
    }
    return Flow();
  }